

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

Symbol __thiscall
google::protobuf::DescriptorBuilder::FindSymbolNotEnforcingDeps
          (DescriptorBuilder *this,string *name,bool build_it)

{
  byte bVar1;
  FileDescriptor *this_00;
  size_type sVar2;
  byte in_DL;
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *in_RSI;
  key_type *in_RDI;
  Symbol SVar3;
  FileDescriptor *file;
  Symbol result;
  bool in_stack_0000003f;
  string *in_stack_00000040;
  DescriptorPool *in_stack_00000048;
  DescriptorBuilder *in_stack_00000050;
  undefined7 in_stack_ffffffffffffffd8;
  
  bVar1 = in_DL & 1;
  SVar3 = FindSymbolNotEnforcingDepsHelper
                    (in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_0000003f);
  this_00 = Symbol::GetFile((Symbol *)CONCAT17(bVar1,in_stack_ffffffffffffffd8));
  if (this_00 != in_RDI[0xb]) {
    sVar2 = std::
            set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            ::count(in_RSI,(key_type *)CONCAT17(bVar1,in_stack_ffffffffffffffd8));
    if (sVar2 == 0) goto LAB_0049d749;
  }
  std::
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::erase((set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
           *)this_00,in_RDI);
LAB_0049d749:
  SVar3._4_4_ = 0;
  return SVar3;
}

Assistant:

Symbol DescriptorBuilder::FindSymbolNotEnforcingDeps(const std::string& name,
                                                     bool build_it) {
  Symbol result = FindSymbolNotEnforcingDepsHelper(pool_, name, build_it);
  // Only find symbols which were defined in this file or one of its
  // dependencies.
  const FileDescriptor* file = result.GetFile();
  if (file == file_ || dependencies_.count(file) > 0) {
    unused_dependency_.erase(file);
  }
  return result;
}